

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highscore.h
# Opt level: O1

void __thiscall Highscore::Set(Highscore *this,size_t id,size_t score)

{
  Entry *pEVar1;
  Entry *pEVar2;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  _Var3;
  Entry *pEVar4;
  Entry *pEVar5;
  
  if (this->mLowestScore <= score) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_1_>>
                      ((this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_finish,id);
    pEVar1 = (this->mEntries).
             super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var3._M_current == pEVar1) {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_2_>>
                        ((this->mEntries).
                         super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                         _M_impl.super__Vector_impl_data._M_start,pEVar1,score);
    }
    pEVar1 = (this->mEntries).
             super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var3._M_current != pEVar1) {
      (_Var3._M_current)->id = id;
      (_Var3._M_current)->score = score;
      pEVar5 = (this->mEntries).
               super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar4 = pEVar5 + 1;
      if (pEVar4 != pEVar1 && pEVar5 != pEVar1) {
        do {
          pEVar2 = pEVar4;
          if (pEVar5->score <= pEVar4->score) {
            pEVar2 = pEVar5;
          }
          pEVar5 = pEVar2;
          pEVar4 = pEVar4 + 1;
        } while (pEVar4 != pEVar1);
      }
      this->mLowestScore = pEVar5->score;
    }
  }
  return;
}

Assistant:

void Set( const size_t id, const size_t score ) {
    if( score < mLowestScore )
      return;

    auto it = std::find_if(
      mEntries.begin(), mEntries.end(),
      [id]( const Entry& candidate ) { return id == candidate.id; } );

    if( it == mEntries.end() ) {
      it = std::find_if(
        mEntries.begin(), mEntries.end(),
        [score]( const Entry& candidate ) { return score > candidate.score; } );
    }

    if( it != mEntries.end() ) {
      it->id    = id;
      it->score = score;

      mLowestScore =
        std::min_element( mEntries.begin(), mEntries.end() )->score;
    }
  }